

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_4_to_1_general
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,int16_t *coef,
               uint8_t *temp_buffer)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  __m128i *f_00;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i alVar7;
  int16_t *in_stack_00000008;
  longlong *in_stack_00000010;
  __m128i f [4];
  __m128i d [4];
  __m128i s [11];
  uint8_t *t;
  int y;
  int x;
  int height_ver;
  int height_hor;
  int width_ver;
  int width_hor;
  __m128i *in_stack_fffffffffffffdb8;
  __m128i *d_00;
  uint8_t *in_stack_fffffffffffffdc0;
  longlong local_228 [3];
  ptrdiff_t in_stack_fffffffffffffdf0;
  uint8_t *in_stack_fffffffffffffdf8;
  __m128i in_stack_fffffffffffffe00;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  longlong local_1a8;
  longlong lStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  longlong local_188 [4];
  longlong local_168;
  longlong lStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  longlong *local_f0;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  int local_c4;
  undefined8 *local_c0;
  int local_b4;
  long local_b0;
  uint8_t *local_a8;
  longlong *local_a0;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined8 *local_8;
  
  local_d0 = in_R8D + 1U & 0xfffffffe;
  local_d4 = in_R8D + 7U & 0xfffffff8;
  local_e4 = in_R9D * 4 + 0xdU & 0xfffffff8;
  local_dc = in_R9D + 1U & 0xfffffffe;
  local_f0 = in_stack_00000010;
  local_d8 = local_e4;
  local_c4 = in_ECX;
  local_c0 = in_RDX;
  local_b4 = in_ESI;
  local_b0 = in_RDI;
  shuffle_filter_ssse3(in_stack_00000008,(__m128i *)local_228);
  local_b0 = local_b0 - (local_b4 * 3 + 7);
  do {
    load_8bit_8x8(in_stack_fffffffffffffdc0,(ptrdiff_t)in_stack_fffffffffffffdb8,(__m128i *)0x7a2198
                 );
    transpose_16bit_4x8(in_stack_fffffffffffffdb8,(__m128i *)0x7a21ad);
    local_e0 = local_d0;
    do {
      local_b0 = local_b0 + 8;
      load_8bit_8x8(in_stack_fffffffffffffdc0,(ptrdiff_t)in_stack_fffffffffffffdb8,
                    (__m128i *)0x7a21f1);
      transpose_16bit_4x8(in_stack_fffffffffffffdb8,(__m128i *)0x7a21fe);
      convolve8_8_ssse3((__m128i *)&local_1a8,(__m128i *)local_228);
      convolve8_8_ssse3((__m128i *)local_188,(__m128i *)local_228);
      local_48 = (short)extraout_XMM0_Qa;
      sStack_46 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_44 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_42 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_40 = (short)extraout_XMM0_Qb;
      sStack_3e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_3c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_3a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      cVar1 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
      cVar2 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
      cVar3 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
      cVar4 = (char)((ulong)extraout_XMM0_Qb >> 0x10);
      cVar5 = (char)((ulong)extraout_XMM0_Qb >> 0x20);
      cVar6 = (char)((ulong)extraout_XMM0_Qb >> 0x30);
      local_1e8._0_2_ =
           CONCAT11((0 < sStack_46) * (sStack_46 < 0x100) * cVar1 - (0xff < sStack_46),
                    (0 < local_48) * (local_48 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_48)
                   );
      local_1e8._0_3_ =
           CONCAT12((0 < sStack_44) * (sStack_44 < 0x100) * cVar2 - (0xff < sStack_44),
                    (undefined2)local_1e8);
      local_1e8._0_4_ =
           CONCAT13((0 < sStack_42) * (sStack_42 < 0x100) * cVar3 - (0xff < sStack_42),
                    (undefined3)local_1e8);
      local_1e8._0_5_ =
           CONCAT14((0 < sStack_40) * (sStack_40 < 0x100) * (char)extraout_XMM0_Qb -
                    (0xff < sStack_40),(undefined4)local_1e8);
      local_1e8._0_6_ =
           CONCAT15((0 < sStack_3e) * (sStack_3e < 0x100) * cVar4 - (0xff < sStack_3e),
                    (undefined5)local_1e8);
      local_1e8._0_7_ =
           CONCAT16((0 < sStack_3c) * (sStack_3c < 0x100) * cVar5 - (0xff < sStack_3c),
                    (undefined6)local_1e8);
      local_1e8 = CONCAT17((0 < sStack_3a) * (sStack_3a < 0x100) * cVar6 - (0xff < sStack_3a),
                           (undefined7)local_1e8);
      uStack_1e0._0_2_ =
           CONCAT11((0 < sStack_46) * (sStack_46 < 0x100) * cVar1 - (0xff < sStack_46),
                    (0 < local_48) * (local_48 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_48)
                   );
      uStack_1e0._0_3_ =
           CONCAT12((0 < sStack_44) * (sStack_44 < 0x100) * cVar2 - (0xff < sStack_44),
                    (undefined2)uStack_1e0);
      uStack_1e0._0_4_ =
           CONCAT13((0 < sStack_42) * (sStack_42 < 0x100) * cVar3 - (0xff < sStack_42),
                    (undefined3)uStack_1e0);
      uStack_1e0._0_5_ =
           CONCAT14((0 < sStack_40) * (sStack_40 < 0x100) * (char)extraout_XMM0_Qb -
                    (0xff < sStack_40),(undefined4)uStack_1e0);
      uStack_1e0._0_6_ =
           CONCAT15((0 < sStack_3e) * (sStack_3e < 0x100) * cVar4 - (0xff < sStack_3e),
                    (undefined5)uStack_1e0);
      uStack_1e0._0_7_ =
           CONCAT16((0 < sStack_3c) * (sStack_3c < 0x100) * cVar5 - (0xff < sStack_3c),
                    (undefined6)uStack_1e0);
      uStack_1e0 = CONCAT17((0 < sStack_3a) * (sStack_3a < 0x100) * cVar6 - (0xff < sStack_3a),
                            (undefined7)uStack_1e0);
      local_68 = (short)extraout_XMM0_Qa_00;
      sStack_66 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_64 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_62 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_60 = (short)extraout_XMM0_Qb_00;
      sStack_5e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_5c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_5a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      cVar1 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      cVar2 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      cVar3 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      cVar4 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      cVar5 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      cVar6 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      local_1d8 = CONCAT17((0 < sStack_5a) * (sStack_5a < 0x100) * cVar6 - (0xff < sStack_5a),
                           CONCAT16((0 < sStack_5c) * (sStack_5c < 0x100) * cVar5 -
                                    (0xff < sStack_5c),
                                    CONCAT15((0 < sStack_5e) * (sStack_5e < 0x100) * cVar4 -
                                             (0xff < sStack_5e),
                                             CONCAT14((0 < sStack_60) * (sStack_60 < 0x100) *
                                                      (char)extraout_XMM0_Qb_00 - (0xff < sStack_60)
                                                      ,CONCAT13((0 < sStack_62) *
                                                                (sStack_62 < 0x100) * cVar3 -
                                                                (0xff < sStack_62),
                                                                CONCAT12((0 < sStack_64) *
                                                                         (sStack_64 < 0x100) * cVar2
                                                                         - (0xff < sStack_64),
                                                                         CONCAT11((0 < sStack_66) *
                                                                                  (sStack_66 < 0x100
                                                                                  ) * cVar1 -
                                                                                  (0xff < sStack_66)
                                                                                  ,(0 < local_68) *
                                                                                   (local_68 < 0x100
                                                                                   ) * (char)
                                                  extraout_XMM0_Qa_00 - (0xff < local_68))))))));
      uStack_1d0 = CONCAT17((0 < sStack_5a) * (sStack_5a < 0x100) * cVar6 - (0xff < sStack_5a),
                            CONCAT16((0 < sStack_5c) * (sStack_5c < 0x100) * cVar5 -
                                     (0xff < sStack_5c),
                                     CONCAT15((0 < sStack_5e) * (sStack_5e < 0x100) * cVar4 -
                                              (0xff < sStack_5e),
                                              CONCAT14((0 < sStack_60) * (sStack_60 < 0x100) *
                                                       (char)extraout_XMM0_Qb_00 -
                                                       (0xff < sStack_60),
                                                       CONCAT13((0 < sStack_62) *
                                                                (sStack_62 < 0x100) * cVar3 -
                                                                (0xff < sStack_62),
                                                                CONCAT12((0 < sStack_64) *
                                                                         (sStack_64 < 0x100) * cVar2
                                                                         - (0xff < sStack_64),
                                                                         CONCAT11((0 < sStack_66) *
                                                                                  (sStack_66 < 0x100
                                                                                  ) * cVar1 -
                                                                                  (0xff < sStack_66)
                                                                                  ,(0 < local_68) *
                                                                                   (local_68 < 0x100
                                                                                   ) * (char)
                                                  extraout_XMM0_Qa_00 - (0xff < local_68))))))));
      local_28 = local_1e8;
      uStack_20 = uStack_1e0;
      local_38 = local_1d8;
      uStack_30 = uStack_1d0;
      store_8bit_4x4_sse2(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                          in_stack_fffffffffffffdf0);
      local_f0 = (longlong *)((long)local_f0 + 4);
      local_e0 = local_e0 - 2;
    } while (local_e0 != 0);
    local_b0 = local_b0 + (int)(local_b4 * 8 + local_d0 * -4);
    local_f0 = (longlong *)((long)local_f0 + (long)(int)(local_d0 * 6));
    local_e4 = local_e4 - 8;
    local_e0 = 0;
  } while (local_e4 != 0);
  local_e0 = local_d4;
  local_f0 = in_stack_00000010;
  do {
    local_a0 = local_f0;
    local_1a8 = *local_f0;
    lStack_1a0 = local_f0[1];
    local_a8 = (uint8_t *)((long)local_f0 + (long)(int)(local_d0 << 1));
    local_198 = *(undefined8 *)local_a8;
    uStack_190 = *(undefined8 *)(local_a8 + 8);
    local_f0 = (longlong *)((long)local_f0 + (long)(int)(local_d0 << 2));
    local_e4 = local_dc;
    do {
      d_00 = (__m128i *)local_188;
      loadu_8bit_16x4((uint8_t *)local_f0,(long)(int)(local_d0 * 2),d_00);
      local_f0 = (longlong *)((long)local_f0 + (long)(int)(local_d0 << 3));
      f_00 = (__m128i *)local_228;
      convolve8_8_ssse3((__m128i *)&local_1a8,f_00);
      alVar7 = convolve8_8_ssse3(d_00,f_00);
      local_88 = (short)extraout_XMM0_Qa_01;
      sStack_86 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x10);
      sStack_84 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x20);
      sStack_82 = (short)((ulong)extraout_XMM0_Qa_01 >> 0x30);
      sStack_80 = (short)extraout_XMM0_Qb_01;
      sStack_7e = (short)((ulong)extraout_XMM0_Qb_01 >> 0x10);
      sStack_7c = (short)((ulong)extraout_XMM0_Qb_01 >> 0x20);
      sStack_7a = (short)((ulong)extraout_XMM0_Qb_01 >> 0x30);
      local_98 = (short)extraout_XMM0_Qa_02;
      sStack_96 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
      sStack_94 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
      sStack_92 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
      sStack_90 = (short)extraout_XMM0_Qb_02;
      sStack_8e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
      sStack_8c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
      sStack_8a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
      local_1e8._0_2_ =
           CONCAT11((0 < sStack_86) * (sStack_86 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_01 >> 0x10) - (0xff < sStack_86),
                    (0 < local_88) * (local_88 < 0x100) * (char)extraout_XMM0_Qa_01 -
                    (0xff < local_88));
      local_1e8._0_3_ =
           CONCAT12((0 < sStack_84) * (sStack_84 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_01 >> 0x20) - (0xff < sStack_84),
                    (undefined2)local_1e8);
      local_1e8._0_4_ =
           CONCAT13((0 < sStack_82) * (sStack_82 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_01 >> 0x30) - (0xff < sStack_82),
                    (undefined3)local_1e8);
      local_1e8._0_5_ =
           CONCAT14((0 < sStack_80) * (sStack_80 < 0x100) * (char)extraout_XMM0_Qb_01 -
                    (0xff < sStack_80),(undefined4)local_1e8);
      local_1e8._0_6_ =
           CONCAT15((0 < sStack_7e) * (sStack_7e < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_01 >> 0x10) - (0xff < sStack_7e),
                    (undefined5)local_1e8);
      local_1e8._0_7_ =
           CONCAT16((0 < sStack_7c) * (sStack_7c < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_01 >> 0x20) - (0xff < sStack_7c),
                    (undefined6)local_1e8);
      local_1e8 = CONCAT17((0 < sStack_7a) * (sStack_7a < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb_01 >> 0x30) - (0xff < sStack_7a),
                           (undefined7)local_1e8);
      uStack_1e0._0_2_ =
           CONCAT11((0 < sStack_96) * (sStack_96 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_02 >> 0x10) - (0xff < sStack_96),
                    (0 < local_98) * (local_98 < 0x100) * (char)extraout_XMM0_Qa_02 -
                    (0xff < local_98));
      uStack_1e0._0_3_ =
           CONCAT12((0 < sStack_94) * (sStack_94 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_02 >> 0x20) - (0xff < sStack_94),
                    (undefined2)uStack_1e0);
      uStack_1e0._0_4_ =
           CONCAT13((0 < sStack_92) * (sStack_92 < 0x100) *
                    (char)((ulong)extraout_XMM0_Qa_02 >> 0x30) - (0xff < sStack_92),
                    (undefined3)uStack_1e0);
      uStack_1e0._0_5_ =
           CONCAT14((0 < sStack_90) * (sStack_90 < 0x100) * (char)extraout_XMM0_Qb_02 -
                    (0xff < sStack_90),(undefined4)uStack_1e0);
      uStack_1e0._0_6_ =
           CONCAT15((0 < sStack_8e) * (sStack_8e < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_02 >> 0x10) - (0xff < sStack_8e),
                    (undefined5)uStack_1e0);
      uStack_1e0._0_7_ =
           CONCAT16((0 < sStack_8c) * (sStack_8c < 0x100) *
                    (char)((ulong)extraout_XMM0_Qb_02 >> 0x20) - (0xff < sStack_8c),
                    (undefined6)uStack_1e0);
      uStack_1e0 = CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) *
                            (char)((ulong)extraout_XMM0_Qb_02 >> 0x30) - (0xff < sStack_8a),
                            (undefined7)uStack_1e0);
      local_8 = local_c0;
      local_18 = local_1e8;
      uStack_10 = uStack_1e0;
      *local_c0 = local_1e8;
      alVar7[0] = (longlong)f_00;
      _mm_storeh_epi64((__m128i *)((long)local_c0 + (long)local_c4),alVar7);
      local_1a8 = local_168;
      lStack_1a0 = lStack_160;
      local_198 = local_158;
      uStack_190 = uStack_150;
      local_c0 = (undefined8 *)((long)local_c0 + (long)(local_c4 << 1));
      local_e4 = local_e4 - 2;
    } while (local_e4 != 0);
    local_f0 = (longlong *)((long)local_f0 + (0x10 - (long)(int)(local_d0 * (local_dc * 4 + 4))));
    local_c0 = (undefined8 *)((long)local_c0 + (8 - (long)(int)(local_dc * local_c4)));
    local_e0 = local_e0 - 8;
  } while (local_e0 != 0);
  return;
}

Assistant:

static void scale_plane_4_to_1_general(const uint8_t *src, const int src_stride,
                                       uint8_t *dst, const int dst_stride,
                                       const int w, const int h,
                                       const int16_t *const coef,
                                       uint8_t *const temp_buffer) {
  const int width_hor = (w + 1) & ~1;
  const int width_ver = (w + 7) & ~7;
  const int height_hor = (4 * h + SUBPEL_TAPS - 2 + 7) & ~7;
  const int height_ver = (h + 1) & ~1;
  int x, y = height_hor;
  uint8_t *t = temp_buffer;
  __m128i s[11], d[4];
  __m128i f[4];

  assert(w && h);

  shuffle_filter_ssse3(coef, f);
  src -= (SUBPEL_TAPS / 2 - 1) * src_stride + SUBPEL_TAPS / 2 + 3;

  // horizontal 2x8
  do {
    load_8bit_8x8(src + 4, src_stride, s);
    // 00 01 10 11 20 21 30 31  40 41 50 51 60 61 70 71
    // 02 03 12 13 22 23 32 33  42 43 52 53 62 63 72 73
    // 04 05 14 15 24 25 34 35  44 45 54 55 64 65 74 75 (overlapped)
    // 06 07 16 17 26 27 36 37  46 47 56 57 66 67 76 77 (overlapped)
    transpose_16bit_4x8(s, s);
    x = width_hor;

    do {
      src += 8;
      load_8bit_8x8(src, src_stride, &s[2]);
      // 04 05 14 15 24 25 34 35  44 45 54 55 64 65 74 75
      // 06 07 16 17 26 27 36 37  46 47 56 57 66 67 76 77
      // 08 09 18 19 28 29 38 39  48 49 58 59 68 69 78 79
      // 0A 0B 1A 1B 2A 2B 3A 3B  4A 4B 5A 5B 6A 6B 7A 7B
      transpose_16bit_4x8(&s[2], &s[2]);

      d[0] = convolve8_8_ssse3(&s[0], f);  // 00 10 20 30 40 50 60 70
      d[1] = convolve8_8_ssse3(&s[2], f);  // 01 11 21 31 41 51 61 71

      // 00 10 20 30 40 50 60 70  xx xx xx xx xx xx xx xx
      // 01 11 21 31 41 51 61 71  xx xx xx xx xx xx xx xx
      d[0] = _mm_packus_epi16(d[0], d[0]);
      d[1] = _mm_packus_epi16(d[1], d[1]);
      // 00 10 01 11 20 30 21 31  40 50 41 51 60 70 61 71
      d[0] = _mm_unpacklo_epi16(d[0], d[1]);
      store_8bit_4x4_sse2(d[0], t, 2 * width_hor);

      s[0] = s[4];
      s[1] = s[5];

      t += 4;
      x -= 2;
    } while (x);
    src += 8 * src_stride - 4 * width_hor;
    t += 6 * width_hor;
    y -= 8;
  } while (y);

  // vertical 8x2
  x = width_ver;
  t = temp_buffer;
  do {
    // 00 10 01 11 02 12 03 13  04 14 05 15 06 16 07 17
    // 20 30 21 31 22 32 23 33  24 34 25 35 26 36 27 37
    s[0] = _mm_loadu_si128((const __m128i *)(t + 0 * width_hor));
    s[1] = _mm_loadu_si128((const __m128i *)(t + 2 * width_hor));
    t += 4 * width_hor;
    y = height_ver;

    do {
      // 40 50 41 51 42 52 43 53  44 54 45 55 46 56 47 57
      // 60 70 61 71 62 72 63 73  64 74 65 75 66 76 67 77
      // 80 90 81 91 82 92 83 93  84 94 85 95 86 96 87 77
      // A0 B0 A1 B1 A2 B2 A3 B3  A4 B4 A5 B5 A6 B6 A7 77
      loadu_8bit_16x4(t, 2 * width_hor, &s[2]);
      t += 8 * width_hor;

      d[0] = convolve8_8_ssse3(&s[0], f);  // 00 01 02 03 04 05 06 07
      d[1] = convolve8_8_ssse3(&s[2], f);  // 10 11 12 13 14 15 16 17

      // 00 01 02 03 04 05 06 07  10 11 12 13 14 15 16 17
      d[0] = _mm_packus_epi16(d[0], d[1]);
      _mm_storel_epi64((__m128i *)(dst + 0 * dst_stride), d[0]);
      _mm_storeh_epi64((__m128i *)(dst + 1 * dst_stride), d[0]);

      s[0] = s[4];
      s[1] = s[5];

      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
    t -= width_hor * (4 * height_ver + 4);
    t += 16;
    dst -= height_ver * dst_stride;
    dst += 8;
    x -= 8;
  } while (x);
}